

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O3

void __thiscall
BoundaryElement::particle_particle_interact
          (BoundaryElement *this,double *potential,double *potential_old,
          array<unsigned_long,_2UL> target_node_element_idxs,
          array<unsigned_long,_2UL> source_node_element_idxs)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Timers_BoundaryElement *pTVar16;
  Elements *pEVar17;
  Params *pPVar18;
  size_t sVar19;
  pointer pdVar20;
  pointer pdVar21;
  pointer pdVar22;
  pointer pdVar23;
  pointer pdVar24;
  pointer pdVar25;
  pointer pdVar26;
  double dVar27;
  double dVar28;
  rep rVar29;
  long lVar30;
  size_t j;
  ulong uVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  
  uVar31 = target_node_element_idxs._M_elems[0];
  pTVar16 = this->timers_;
  rVar29 = std::chrono::_V2::steady_clock::now();
  (pTVar16->particle_particle_interact).start_time_.__d.__r = rVar29;
  if (uVar31 < target_node_element_idxs._M_elems[1]) {
    pEVar17 = this->elements_;
    pPVar18 = this->params_;
    dVar2 = pPVar18->phys_eps_;
    dVar3 = pPVar18->phys_kappa_;
    sVar19 = (pEVar17->super_Particles).num_;
    pdVar20 = (pEVar17->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar21 = (pEVar17->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar22 = (pEVar17->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar23 = (pEVar17->nx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar24 = (pEVar17->ny_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar25 = (pEVar17->nz_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar28 = pPVar18->phys_kappa2_;
    pdVar26 = (pEVar17->area_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      dVar34 = 0.0;
      dVar35 = 0.0;
      if (source_node_element_idxs._M_elems[0] < source_node_element_idxs._M_elems[1]) {
        dVar4 = pdVar20[uVar31];
        dVar5 = pdVar21[uVar31];
        dVar6 = pdVar22[uVar31];
        dVar7 = pdVar23[uVar31];
        dVar8 = pdVar24[uVar31];
        dVar9 = pdVar25[uVar31];
        lVar30 = 0;
        do {
          dVar40 = pdVar20[source_node_element_idxs._M_elems[0] + lVar30] - dVar4;
          dVar41 = pdVar21[source_node_element_idxs._M_elems[0] + lVar30] - dVar5;
          dVar39 = pdVar22[source_node_element_idxs._M_elems[0] + lVar30] - dVar6;
          dVar33 = SQRT(dVar39 * dVar39 + dVar40 * dVar40 + dVar41 * dVar41);
          if (0.0 < dVar33) {
            dVar10 = pdVar25[source_node_element_idxs._M_elems[0] + lVar30];
            dVar11 = pdVar24[source_node_element_idxs._M_elems[0] + lVar30];
            dVar12 = pdVar23[source_node_element_idxs._M_elems[0] + lVar30];
            dVar32 = dVar3 * dVar33;
            dVar13 = potential_old[source_node_element_idxs._M_elems[0] + sVar19 + lVar30];
            dVar14 = potential_old[source_node_element_idxs._M_elems[0] + lVar30];
            dVar15 = pdVar26[source_node_element_idxs._M_elems[0] + lVar30];
            dVar27 = exp(-dVar32);
            dVar43 = (dVar32 + 1.0) * dVar27;
            auVar36._8_8_ = 0x3ff0000000000000;
            auVar36._0_8_ = dVar43;
            auVar37._8_8_ = dVar33;
            auVar37._0_8_ = dVar2;
            auVar37 = divpd(auVar36,auVar37);
            dVar38 = auVar37._8_8_;
            dVar33 = dVar38 * 0.079577471545948;
            dVar32 = dVar33 * dVar38;
            dVar42 = (dVar39 * dVar10 + dVar40 * dVar12 + dVar11 * dVar41) * dVar38;
            dVar40 = (dVar39 * dVar9 + dVar40 * dVar7 + dVar8 * dVar41) * dVar38;
            dVar39 = dVar32 * (dVar40 * -3.0 * dVar42 +
                              dVar10 * dVar9 + dVar12 * dVar7 + dVar8 * dVar11) * dVar38;
            dVar34 = dVar34 + dVar15 * (dVar14 * ((dVar27 * dVar33 * dVar40 * -dVar28 * dVar42 +
                                                  dVar39 * dVar43) - dVar39) +
                                       dVar13 * (1.0 - auVar37._0_8_) * dVar40 * dVar32);
            dVar35 = dVar35 + dVar15 * (dVar14 * (dVar2 * -dVar43 + 1.0) * dVar32 * dVar42 +
                                       dVar13 * (dVar33 - dVar27 * dVar33));
          }
          lVar30 = lVar30 + 1;
        } while (source_node_element_idxs._M_elems[1] - source_node_element_idxs._M_elems[0] !=
                 lVar30);
      }
      pdVar1 = potential + uVar31;
      *pdVar1 = dVar35 + *pdVar1;
      pdVar1[sVar19] = dVar34 + pdVar1[sVar19];
      uVar31 = uVar31 + 1;
    } while (uVar31 != target_node_element_idxs._M_elems[1]);
  }
  pTVar16 = this->timers_;
  lVar30 = std::chrono::_V2::steady_clock::now();
  (pTVar16->particle_particle_interact).end_time_.__d.__r = lVar30;
  (pTVar16->particle_particle_interact).elapsed_time_.__r =
       (double)(lVar30 - (pTVar16->particle_particle_interact).start_time_.__d.__r) / 1000000.0 +
       (pTVar16->particle_particle_interact).elapsed_time_.__r;
  return;
}

Assistant:

void BoundaryElement::particle_particle_interact(double* __restrict potential,
                                          const double* __restrict potential_old,
                                          std::array<std::size_t, 2> target_node_element_idxs,
                                          std::array<std::size_t, 2> source_node_element_idxs)
{
    timers_.particle_particle_interact.start();

    std::size_t target_node_element_begin = target_node_element_idxs[0];
    std::size_t target_node_element_end   = target_node_element_idxs[1];

    std::size_t source_node_element_begin = source_node_element_idxs[0];
    std::size_t source_node_element_end   = source_node_element_idxs[1];
    
    double eps    = params_.phys_eps_;
    double kappa  = params_.phys_kappa_;
    double kappa2 = params_.phys_kappa2_;
    
    const double* __restrict elements_x_ptr    = elements_.x_ptr();
    const double* __restrict elements_y_ptr    = elements_.y_ptr();
    const double* __restrict elements_z_ptr    = elements_.z_ptr();
    
    const double* __restrict elements_nx_ptr   = elements_.nx_ptr();
    const double* __restrict elements_ny_ptr   = elements_.ny_ptr();
    const double* __restrict elements_nz_ptr   = elements_.nz_ptr();

    const double* __restrict elements_area_ptr = elements_.area_ptr();
    
    std::size_t num_elements = elements_.num();

#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop async(stream_id) present(elements_x_ptr,  elements_y_ptr,  elements_z_ptr, \
                                      elements_nx_ptr, elements_ny_ptr, elements_nz_ptr, \
                                      elements_area_ptr, potential, potential_old)
#endif
    for (std::size_t j = target_node_element_begin; j < target_node_element_end; ++j) {
        
        double target_x = elements_x_ptr[j];
        double target_y = elements_y_ptr[j];
        double target_z = elements_z_ptr[j];
        
        double target_nx = elements_nx_ptr[j];
        double target_ny = elements_ny_ptr[j];
        double target_nz = elements_nz_ptr[j];
        
        double pot_temp_1 = 0.;
        double pot_temp_2 = 0.;

#ifdef OPENACC_ENABLED
        #pragma acc loop reduction(+:pot_temp_1,pot_temp_2)
#endif
        for (std::size_t k = source_node_element_begin; k < source_node_element_end; ++k) {
        
            double source_x = elements_x_ptr[k];
            double source_y = elements_y_ptr[k];
            double source_z = elements_z_ptr[k];
            
            double source_nx = elements_nx_ptr[k];
            double source_ny = elements_ny_ptr[k];
            double source_nz = elements_nz_ptr[k];
            double source_area = elements_area_ptr[k];
            
            double potential_old_0 = potential_old[k];
            double potential_old_1 = potential_old[k + num_elements];
            
            double dist_x = source_x - target_x;
            double dist_y = source_y - target_y;
            double dist_z = source_z - target_z;
            double r = std::sqrt(dist_x * dist_x + dist_y * dist_y + dist_z * dist_z);
            
            if (r > 0) {
                double one_over_r = 1. / r;
                double G0 = constants::ONE_OVER_4PI * one_over_r;
                double kappa_r = kappa * r;
                double exp_kappa_r = std::exp(-kappa_r);
                double Gk = exp_kappa_r * G0;
                
                double source_cos  = (source_nx * dist_x + source_ny * dist_y + source_nz * dist_z) * one_over_r;
                double target_cos = (target_nx * dist_x + target_ny * dist_y + target_nz * dist_z) * one_over_r;
                
                double tp1 = G0 * one_over_r;
                double tp2 = (1. + kappa_r) * exp_kappa_r;

                double dot_tqsq = source_nx * target_nx + source_ny * target_ny + source_nz * target_nz;
                double G3 = (dot_tqsq - 3. * target_cos * source_cos) * one_over_r * tp1;
                double G4 = tp2 * G3 - kappa2 * target_cos * source_cos * Gk;

                double L1 = source_cos  * tp1 * (1. - tp2 * eps);
                double L2 = G0 - Gk;
                double L3 = G4 - G3;
                double L4 = target_cos * tp1 * (1. - tp2 / eps);
                
                pot_temp_1 += (L1 * potential_old_0 + L2 * potential_old_1) * source_area;
                pot_temp_2 += (L3 * potential_old_0 + L4 * potential_old_1) * source_area;
            }
        }
        
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        potential[j]                += pot_temp_1;
#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif OPENMP_ENABLED
        #pragma omp atomic update
#endif
        potential[j + num_elements] += pot_temp_2;
    }

    timers_.particle_particle_interact.stop();
}